

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzD::ChNodeFEAxyzD
          (ChNodeFEAxyzD *this,ChVector<double> *initial_pos,ChVector<double> *initial_dir)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChVariablesGenericDiagonalMass *this_00;
  ChVector<double> local_38;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x138);
  *(undefined ***)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x18 =
       &PTR__ChLoadable_00b2c638;
  local_38.m_data[0] = initial_pos->m_data[0];
  local_38.m_data[1] = initial_pos->m_data[1];
  local_38.m_data[2] = initial_pos->m_data[2];
  ChNodeFEAxyz::ChNodeFEAxyz
            (&this->super_ChNodeFEAxyz,&PTR_construction_vtable_32__00b556f8,&local_38);
  (this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase = (_func_int **)0xb552a8;
  *(undefined8 *)&this->field_0x138 = 0xb55638;
  *(undefined8 *)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x18 = 0xb55498;
  (this->super_ChNodeFEAxyz).super_ChVariableTupleCarrier_1vars<3>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x2d8);
  *(double *)&(this->super_ChNodeFEAxyz).field_0xf0 = initial_dir->m_data[0];
  *(double *)&this->field_0xf8 = initial_dir->m_data[1];
  *(double *)&this->field_0x100 = initial_dir->m_data[2];
  dVar2 = VNULL;
  (this->D_dt).m_data[0] = VNULL;
  dVar3 = DAT_00b90ac0;
  (this->D_dt).m_data[1] = DAT_00b90ac0;
  dVar4 = DAT_00b90ac8;
  (this->D_dt).m_data[2] = DAT_00b90ac8;
  (this->D_dtdt).m_data[0] = dVar2;
  (this->D_dtdt).m_data[1] = dVar3;
  (this->D_dtdt).m_data[2] = dVar4;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyz).field_0xe8 = this_00;
  lVar1 = (this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (-1 < lVar1) {
    if (lVar1 != 0) {
      memset((this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data,0,lVar1 << 3);
    }
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChNodeFEAxyzD::ChNodeFEAxyzD(ChVector<> initial_pos, ChVector<> initial_dir)
    : ChNodeFEAxyz(initial_pos), D(initial_dir), D_dt(VNULL), D_dtdt(VNULL) {
    variables_D = new ChVariablesGenericDiagonalMass(3);
    // default: no atomic mass associated to fea node, the fea element will add mass matrix
    variables_D->GetMassDiagonal().setZero();
}